

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_k_lgap.c
# Opt level: O0

void func_vxc_pol(xc_func_type *p,size_t ip,double *rho,double *sigma,double *lapl,double *tau,
                 xc_mgga_out_params *out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double *pdVar7;
  double *in_RCX;
  long lVar8;
  double *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R9;
  double dVar9;
  double __x;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double __x_00;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  long *in_stack_00000008;
  hyb_mgga_xc_gas22_params *params;
  double tvtau1;
  double t1773;
  double t1772;
  double t1767;
  double t1764;
  double t1761;
  double t1758;
  double t1755;
  double t1754;
  double t1751;
  double t1750;
  double t1749;
  double t1747;
  double t1745;
  double t1744;
  double t1739;
  double t1737;
  double t1727;
  double t1724;
  double t1723;
  double t1722;
  double t1720;
  double tvtau0;
  double t1716;
  double t1715;
  double t1710;
  double t1707;
  double t1704;
  double t1701;
  double t1698;
  double t1697;
  double t1694;
  double t1693;
  double t1692;
  double t1690;
  double t1689;
  double t1687;
  double t1686;
  double t1681;
  double t1679;
  double t1669;
  double t1666;
  double t1665;
  double t1664;
  double t1662;
  double tvlapl1;
  double tvlapl0;
  double tvsigma2;
  double t1658;
  double t1657;
  double t1653;
  double t1652;
  double t1651;
  double t1650;
  double t1640;
  double t1637;
  double t1636;
  double t1629;
  double t1626;
  double t1625;
  double t1624;
  double t1620;
  double t1618;
  double tvsigma1;
  double tvsigma0;
  double t1613;
  double t1612;
  double t1609;
  double t1607;
  double t1606;
  double t1605;
  double t1604;
  double t1603;
  double t1602;
  double t1592;
  double t1589;
  double t1588;
  double t1581;
  double t1578;
  double t1577;
  double t1576;
  double t1572;
  double t1570;
  double tvrho1;
  double t1564;
  double t1563;
  double t1556;
  double t1555;
  double t1552;
  double t1549;
  double t1546;
  double t1543;
  double t1540;
  double t1539;
  double t1536;
  double t1535;
  double t1534;
  double t1532;
  double t1530;
  double t1529;
  double t1528;
  double t1524;
  double t1523;
  double t1521;
  double t1518;
  double t1515;
  double t1514;
  double t1503;
  double t1502;
  double t1498;
  double t1497;
  double t1496;
  double t1495;
  double t1493;
  double t1492;
  double t1491;
  double t1487;
  double t1486;
  double t1484;
  double t1483;
  double t1481;
  double t1480;
  double t1479;
  double t1478;
  double t1475;
  double t1474;
  double t1473;
  double t1469;
  double t1468;
  double t1467;
  double t1464;
  double t1459;
  double t1455;
  double t1454;
  double t1450;
  double t1449;
  double t1445;
  double t1442;
  double t1434;
  double t1433;
  double t1427;
  double t1426;
  double t1422;
  double t1421;
  double t1414;
  double t1412;
  double t1410;
  double t1409;
  double t1407;
  double t1405;
  double t1403;
  double t1400;
  double t1399;
  double t1398;
  double t1396;
  double t1394;
  double t1392;
  double t1388;
  double t1387;
  double t1386;
  double t1382;
  double t1379;
  double t1371;
  double t1370;
  double t1364;
  double t1363;
  double t1359;
  double t1358;
  double t1351;
  double t1349;
  double t1347;
  double t1346;
  double t1344;
  double t1342;
  double t1340;
  double t1337;
  double t1336;
  double t1335;
  double t1333;
  double t1331;
  double t1329;
  double t1325;
  double t1324;
  double t1320;
  double t1319;
  double t1318;
  double t1315;
  double t1314;
  double t1311;
  double t1310;
  double t1306;
  double t1305;
  double t1304;
  double t1302;
  double t1301;
  double t1297;
  double t1295;
  double t1292;
  double t1291;
  double t1290;
  double t1289;
  double t1285;
  double t1282;
  double t1270;
  double t1267;
  double t1265;
  double t1263;
  double t1261;
  double t1259;
  double t1257;
  double t1255;
  double t1252;
  double t1251;
  double t1248;
  double t1243;
  double t1240;
  double t1238;
  double t1237;
  double t1233;
  double t1232;
  double t1231;
  double t1230;
  double t1226;
  double t1223;
  double t1211;
  double t1208;
  double t1206;
  double t1204;
  double t1202;
  double t1200;
  double t1198;
  double t1196;
  double t1193;
  double t1192;
  double t1189;
  double t1184;
  double t1181;
  double t1179;
  double tvrho0;
  double t1176;
  double t1175;
  double t1172;
  double t1171;
  double t1169;
  double t1167;
  double t1166;
  double t1163;
  double t1162;
  double t1161;
  double t1160;
  double t1159;
  double t1158;
  double t1157;
  double t1156;
  double t1155;
  double t1154;
  double t1153;
  double t1150;
  double t1149;
  double t1146;
  double t1145;
  double t1144;
  double t1143;
  double t1139;
  double t1134;
  double t1133;
  double t1130;
  double t1129;
  double t1128;
  double t1127;
  double t1123;
  double t1122;
  double t1120;
  double t1118;
  double t1117;
  double t1116;
  double t1115;
  double t1114;
  double t1112;
  double t1110;
  double t1109;
  double t1107;
  double t1105;
  double t1102;
  double t1101;
  double t1100;
  double t1097;
  double t1096;
  double t1095;
  double t1090;
  double t1089;
  double t1088;
  double t1082;
  double t1081;
  double t1080;
  double t1075;
  double t1074;
  double t1073;
  double t1068;
  double t1067;
  double t1065;
  double t1062;
  double t1059;
  double t1057;
  double t1056;
  double t1055;
  double t1054;
  double t1052;
  double t1051;
  double t1050;
  double t1048;
  double t1047;
  double t1046;
  double t1044;
  double t1041;
  double t1040;
  double t1039;
  double t1037;
  double t1035;
  double t1034;
  double t1033;
  double t1031;
  double t1030;
  double t1029;
  double t1028;
  double t1025;
  double t1024;
  double t1023;
  double t1019;
  double t1016;
  double t1014;
  double t1007;
  double t1006;
  double t1005;
  double t1003;
  double t1000;
  double t998;
  double t997;
  double t996;
  double t994;
  double t993;
  double t991;
  double t988;
  double t987;
  double t986;
  double t984;
  double t981;
  double t979;
  double t978;
  double t977;
  double t974;
  double t972;
  double t971;
  double t969;
  double t968;
  double t967;
  double t965;
  double t963;
  double t962;
  double t961;
  double t958;
  double t957;
  double t955;
  double t953;
  double t952;
  double t951;
  double t950;
  double t949;
  double t948;
  double t947;
  double t946;
  double t944;
  double t942;
  double t940;
  double t937;
  double t936;
  double t935;
  double t932;
  double t931;
  double t930;
  double t919;
  double t918;
  double t914;
  double t913;
  double t912;
  double t911;
  double t909;
  double t908;
  double t907;
  double t903;
  double t902;
  double t900;
  double t899;
  double t897;
  double t896;
  double t895;
  double t894;
  double t891;
  double t890;
  double t889;
  double t885;
  double t884;
  double t883;
  double t880;
  double t875;
  double t871;
  double t870;
  double t866;
  double t865;
  double t861;
  double t858;
  double t856;
  double t849;
  double t848;
  double t847;
  double t845;
  double t842;
  double t840;
  double t839;
  double t838;
  double t836;
  double t835;
  double t833;
  double t830;
  double t829;
  double t828;
  double t826;
  double t823;
  double t821;
  double t820;
  double t819;
  double t816;
  double t814;
  double t813;
  double t811;
  double t810;
  double t809;
  double t807;
  double t805;
  double t804;
  double t803;
  double t801;
  double t800;
  double t797;
  double t796;
  double t794;
  double t792;
  double t791;
  double t790;
  double t789;
  double t788;
  double t787;
  double t786;
  double t785;
  double t783;
  double t781;
  double t779;
  double t776;
  double t775;
  double t774;
  double t771;
  double t770;
  double t766;
  double t765;
  double t764;
  double t763;
  double t759;
  double t756;
  double t751;
  double t747;
  double t746;
  double t742;
  double t740;
  double t736;
  double t732;
  double t728;
  double t724;
  double t720;
  double t716;
  double t715;
  double t712;
  double t711;
  double t708;
  double t707;
  double t704;
  double t702;
  double t701;
  double t700;
  double t699;
  double t698;
  double t697;
  double t696;
  double t694;
  double t693;
  double t689;
  double t688;
  double t687;
  double t686;
  double t684;
  double t682;
  double t680;
  double t677;
  double t675;
  double t674;
  double t670;
  double t669;
  double t668;
  double t665;
  double t664;
  double t661;
  double t660;
  double t656;
  double t655;
  double t654;
  double t652;
  double t651;
  double t647;
  double t645;
  double t642;
  double t641;
  double t640;
  double t639;
  double t635;
  double t632;
  double t627;
  double t623;
  double t622;
  double t618;
  double t616;
  double t612;
  double t608;
  double t604;
  double t600;
  double t596;
  double t592;
  double t591;
  double t588;
  double t587;
  double t584;
  double t583;
  double t580;
  double t578;
  double t577;
  double t576;
  double t575;
  double t574;
  double t573;
  double t572;
  double t570;
  double t568;
  double t567;
  double t565;
  double t564;
  double t560;
  double t559;
  double t558;
  double t557;
  double t555;
  double t553;
  double t551;
  double t550;
  double t547;
  double t545;
  double t544;
  double t543;
  double tzk0;
  double t542;
  double t541;
  double t538;
  double t537;
  double t536;
  double t535;
  double t532;
  double t531;
  double t530;
  double t529;
  double t528;
  double t527;
  double t526;
  double t525;
  double t524;
  double t523;
  double t521;
  double t519;
  double t518;
  double t517;
  double t516;
  double t515;
  double t513;
  double t512;
  double t511;
  double t510;
  double t509;
  double t508;
  double t507;
  double t505;
  double t502;
  double t500;
  double t496;
  double t495;
  double t493;
  double t492;
  double t491;
  double t488;
  double t483;
  double t479;
  double t478;
  double t475;
  double t470;
  double t468;
  double t467;
  double t466;
  double t465;
  double t464;
  double t463;
  double t462;
  double t461;
  double t460;
  double t459;
  double t458;
  double t457;
  double t456;
  double t454;
  double t453;
  double t450;
  double t448;
  double t445;
  double t442;
  double t441;
  double t439;
  double t437;
  double t436;
  double t431;
  double t430;
  double t429;
  double t428;
  double t427;
  double t424;
  double t423;
  double t421;
  double t420;
  double t419;
  double t418;
  double t417;
  double t416;
  double t415;
  double t414;
  double t413;
  double t412;
  double t410;
  double t409;
  double t408;
  double t407;
  double t405;
  double t401;
  double t400;
  double t398;
  double t397;
  double t394;
  double t388;
  double t387;
  double t386;
  double t383;
  double t378;
  double t374;
  double t373;
  double t370;
  double t365;
  double t363;
  double t361;
  double t360;
  double t357;
  double t355;
  double t353;
  double t351;
  double t348;
  double t347;
  double t345;
  double t343;
  double t341;
  double t340;
  double t339;
  double t338;
  double t333;
  double t332;
  double t331;
  double t330;
  double t329;
  double t328;
  double t325;
  double t324;
  double t322;
  double t321;
  double t320;
  double t319;
  double t318;
  double t317;
  double t316;
  double t315;
  double t314;
  double t313;
  double t312;
  double t310;
  double t309;
  double t308;
  double t307;
  double t306;
  double t304;
  double t303;
  double t299;
  double t298;
  double t296;
  double t295;
  double t294;
  double t291;
  double t285;
  double t284;
  double t283;
  double t280;
  double t275;
  double t271;
  double t270;
  double t267;
  double t262;
  double t260;
  double t259;
  double t255;
  double t253;
  double t251;
  double t250;
  double t247;
  double t245;
  double t243;
  double t242;
  double t241;
  double t240;
  double t239;
  double t238;
  double t237;
  double t236;
  double t234;
  double t231;
  double t230;
  double t228;
  double t226;
  double t224;
  double t223;
  double t222;
  double t221;
  double t220;
  double t219;
  double t216;
  double t215;
  double t214;
  double t212;
  double t211;
  double t210;
  double t209;
  double t208;
  double t207;
  double t202;
  double t201;
  double t199;
  double t198;
  double t196;
  double t195;
  double t194;
  double t193;
  double t192;
  double t191;
  double t187;
  double t184;
  double t181;
  double t180;
  double t178;
  double t177;
  double t175;
  double t173;
  double t172;
  double t169;
  double t168;
  double t166;
  double t163;
  double t160;
  double t157;
  double t156;
  double t154;
  double t153;
  double t151;
  double t150;
  double t147;
  double t146;
  double t145;
  double t144;
  double t143;
  double t140;
  double t139;
  double t138;
  double t137;
  double t136;
  double t134;
  double t133;
  double t132;
  double t130;
  double t127;
  double t126;
  double t125;
  double t123;
  double t122;
  double t121;
  double t120;
  double t119;
  double t118;
  double t116;
  double t115;
  double t114;
  double t113;
  double t112;
  double t111;
  double t110;
  double t109;
  double t105;
  double t104;
  double t102;
  double t101;
  double t99;
  double t98;
  double t97;
  double t96;
  double t95;
  double t94;
  double t93;
  double t92;
  double t88;
  double t85;
  double t82;
  double t81;
  double t79;
  double t78;
  double t76;
  double t74;
  double t73;
  double t72;
  double t69;
  double t68;
  double t66;
  double t63;
  double t60;
  double t57;
  double t56;
  double t54;
  double t53;
  double t51;
  double t50;
  double t47;
  double t46;
  double t45;
  double t44;
  double t43;
  double t40;
  double t39;
  double t38;
  double t37;
  double t36;
  double t35;
  double t34;
  double t33;
  double t32;
  double t31;
  double t30;
  double t29;
  double t28;
  double t27;
  double t26;
  double t25;
  double t24;
  double t22;
  double t21;
  double t20;
  double t19;
  double t18;
  double t17;
  double t16;
  double t15;
  double t14;
  double t13;
  double t12;
  double t10;
  double t9;
  double t8;
  double t7;
  double t6;
  double t5;
  double t4;
  double t3;
  double local_1e10;
  double local_1e08;
  double local_1e00;
  double local_1df8;
  double local_1df0;
  double local_1de8;
  double local_1de0;
  double local_1dd8;
  double local_1dd0;
  double local_1dc8;
  double local_1dc0;
  double local_1db8;
  double local_1db0;
  double local_1da8;
  double local_1da0;
  double local_1d98;
  double local_1d90;
  double local_1d88;
  double local_1d80;
  double local_1d78;
  double local_1d70;
  double local_1d68;
  double local_1d60;
  double local_1d58;
  double local_1d50;
  double local_1d48;
  double local_1d40;
  double local_1d38;
  double local_1d30;
  double local_1d28;
  double local_1d20;
  double local_1d18;
  double local_1d10;
  double local_1d08;
  double local_1d00;
  double local_1cf8;
  double local_1cf0;
  double local_1ce8;
  double local_1cd8;
  double local_1cc8;
  double local_1cc0;
  double local_1cb8;
  double local_1cb0;
  double local_1ca0;
  double local_1c98;
  double local_1c90;
  double local_1c88;
  double local_1c80;
  double local_1c78;
  bool local_1c69;
  double local_1c68;
  double local_1c60;
  double local_1c58;
  double local_1c50;
  double local_1c48;
  double local_1c40;
  bool local_1c31;
  
  pdVar7 = (double *)in_RDI[0x2f];
  dVar9 = *in_RDX - in_RDX[1];
  __x = *in_RDX + in_RDX[1];
  dVar10 = 1.0 / __x;
  dVar11 = dVar9 * dVar10 + 1.0;
  dVar12 = (double)(dVar11 <= (double)in_RDI[0x31]);
  local_1c31 = *in_RDX <= (double)in_RDI[0x30] || dVar12 != 0.0;
  dVar13 = (double)local_1c31;
  dVar14 = cbrt(0.3183098861837907);
  dVar15 = dVar14 * 2.519842099789747;
  dVar16 = dVar15 * 1.2599210498948732;
  dVar17 = dVar11 * 1.4422495703074083 * dVar16;
  dVar18 = (double)(2.0 <= (double)in_RDI[0x31]);
  local_1cc8 = cbrt((double)in_RDI[0x31]);
  local_1cf0 = local_1cc8 * (double)in_RDI[0x31];
  local_1c40 = local_1cf0;
  if ((dVar18 == 0.0) && (!NAN(dVar18))) {
    local_1c40 = 2.5198420997897464;
  }
  dVar19 = cbrt(__x);
  dVar20 = local_1c40 * dVar19;
  dVar21 = 1.0 / dVar11;
  dVar22 = cbrt(dVar21);
  dVar23 = 1.0 / dVar22;
  dVar24 = cbrt(9.0);
  dVar25 = dVar24 * dVar24 * dVar14 * dVar14;
  dVar24 = (double)in_RDI[4];
  dVar26 = dVar25 * dVar24 * 1.4422495703074083;
  dVar27 = 1.0 / dVar19;
  dVar28 = dVar27 * 1.2599210498948732;
  local_1c48 = local_1cc8;
  if ((dVar18 == 0.0) && (!NAN(dVar18))) {
    local_1c48 = 1.2599210498948732;
  }
  local_1c48 = 1.0 / local_1c48;
  local_1c58 = (dVar26 * dVar28 * dVar22 * local_1c48) / 18.0;
  dVar18 = (double)(1.35 <= local_1c58);
  dVar29 = (double)(1.35 < local_1c58);
  local_1c50 = local_1c58;
  if ((dVar29 == 0.0) && (!NAN(dVar29))) {
    local_1c50 = 1.35;
  }
  dVar30 = local_1c50 * local_1c50;
  dVar31 = dVar30 * dVar30;
  dVar32 = dVar31 * dVar31;
  if ((dVar29 != 0.0) || (NAN(dVar29))) {
    local_1c58 = 1.35;
  }
  dVar33 = sqrt(3.141592653589793);
  dVar34 = 1.0 / local_1c58;
  dVar35 = erf(dVar34 / 2.0);
  dVar36 = local_1c58 * local_1c58;
  dVar37 = exp(-(1.0 / dVar36) / 4.0);
  dVar38 = -(dVar36 * 2.0) * (dVar37 - 1.0) + (dVar37 - 1.5);
  dVar35 = local_1c58 * 2.0 * dVar38 + dVar33 * dVar35;
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    local_1c60 = (((((((1.0 / dVar30) / 36.0 - (1.0 / dVar31) / 960.0) +
                     (1.0 / (dVar31 * dVar30)) / 26880.0) - (1.0 / dVar32) / 829440.0) +
                   ((1.0 / dVar32) / dVar30) / 28385280.0) -
                  ((1.0 / dVar32) / dVar31) / 1073479680.0) +
                 ((1.0 / dVar32) / (dVar31 * dVar30)) / 44590694400.0) -
                 (1.0 / (dVar32 * dVar32)) / 2021444812800.0;
  }
  else {
    local_1c60 = -(local_1c58 * 2.6666666666666665) * dVar35 + 1.0;
  }
  dVar39 = dVar23 * local_1c60;
  dVar88 = *pdVar7;
  dVar1 = pdVar7[1];
  dVar40 = dVar1 * *in_RCX;
  dVar41 = *in_RDX * *in_RDX;
  dVar42 = cbrt(*in_RDX);
  dVar43 = dVar42 * dVar42;
  dVar44 = (1.0 / dVar43) / dVar41;
  dVar45 = *in_RCX * dVar44;
  dVar46 = dVar45 * 0.003840616724010807 + 1.0;
  dVar47 = 1.0 / dVar46;
  dVar2 = pdVar7[2];
  dVar48 = cbrt(9.869604401089358);
  dVar48 = dVar48 * dVar48 * 3.3019272488946267;
  dVar49 = dVar48 * 0.3;
  dVar50 = (1.0 / dVar43) / *in_RDX;
  dVar51 = *in_R9 * dVar50;
  dVar52 = dVar49 - dVar51;
  dVar53 = dVar2 * dVar52;
  dVar54 = dVar49 + dVar51;
  dVar55 = 1.0 / dVar54;
  dVar56 = dVar53 * dVar55 + dVar40 * 0.003840616724010807 * dVar44 * dVar47 + dVar88;
  dVar57 = dVar20 * dVar39 * dVar56;
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    local_1c68 = 0.0;
  }
  else {
    local_1c68 = dVar17 * -0.046875 * dVar57;
  }
  dVar58 = 1.0 - dVar9 * dVar10;
  dVar59 = (double)(dVar58 <= (double)in_RDI[0x31]);
  local_1c69 = in_RDX[1] <= (double)in_RDI[0x30] || dVar59 != 0.0;
  dVar60 = (double)local_1c69;
  dVar61 = dVar58 * 1.4422495703074083 * dVar16;
  dVar62 = 1.0 / dVar58;
  dVar63 = cbrt(dVar62);
  dVar64 = 1.0 / dVar63;
  local_1c80 = (dVar26 * dVar28 * dVar63 * local_1c48) / 18.0;
  dVar65 = (double)(1.35 <= local_1c80);
  dVar66 = (double)(1.35 < local_1c80);
  local_1c78 = local_1c80;
  if ((dVar66 == 0.0) && (!NAN(dVar66))) {
    local_1c78 = 1.35;
  }
  dVar67 = local_1c78 * local_1c78;
  dVar68 = dVar67 * dVar67;
  dVar69 = dVar68 * dVar68;
  if ((dVar66 != 0.0) || (NAN(dVar66))) {
    local_1c80 = 1.35;
  }
  dVar70 = 1.0 / local_1c80;
  dVar71 = erf(dVar70 / 2.0);
  dVar72 = local_1c80 * local_1c80;
  dVar73 = exp(-(1.0 / dVar72) / 4.0);
  dVar74 = -(dVar72 * 2.0) * (dVar73 - 1.0) + (dVar73 - 1.5);
  dVar33 = local_1c80 * 2.0 * dVar74 + dVar33 * dVar71;
  if ((dVar65 != 0.0) || (NAN(dVar65))) {
    local_1c88 = (((((((1.0 / dVar67) / 36.0 - (1.0 / dVar68) / 960.0) +
                     (1.0 / (dVar68 * dVar67)) / 26880.0) - (1.0 / dVar69) / 829440.0) +
                   ((1.0 / dVar69) / dVar67) / 28385280.0) -
                  ((1.0 / dVar69) / dVar68) / 1073479680.0) +
                 ((1.0 / dVar69) / (dVar68 * dVar67)) / 44590694400.0) -
                 (1.0 / (dVar69 * dVar69)) / 2021444812800.0;
  }
  else {
    local_1c88 = -(local_1c80 * 2.6666666666666665) * dVar33 + 1.0;
  }
  dVar71 = dVar64 * local_1c88;
  dVar75 = dVar1 * in_RCX[2];
  dVar76 = in_RDX[1] * in_RDX[1];
  dVar77 = cbrt(in_RDX[1]);
  dVar78 = dVar77 * dVar77;
  dVar79 = (1.0 / dVar78) / dVar76;
  dVar80 = in_RCX[2] * dVar79;
  dVar81 = dVar80 * 0.003840616724010807 + 1.0;
  dVar82 = 1.0 / dVar81;
  dVar83 = (1.0 / dVar78) / in_RDX[1];
  dVar84 = in_R9[1] * dVar83;
  dVar85 = dVar49 - dVar84;
  dVar86 = dVar2 * dVar85;
  dVar49 = dVar49 + dVar84;
  dVar87 = 1.0 / dVar49;
  dVar88 = dVar86 * dVar87 + dVar75 * 0.003840616724010807 * dVar79 * dVar82 + dVar88;
  dVar89 = dVar20 * dVar71 * dVar88;
  if ((dVar60 != 0.0) || (NAN(dVar60))) {
    local_1c90 = 0.0;
  }
  else {
    local_1c90 = dVar61 * -0.046875 * dVar89;
  }
  if ((dVar12 != 0.0) || (local_1c98 = dVar11, NAN(dVar12))) {
    local_1c98 = (double)in_RDI[0x31];
  }
  dVar90 = dVar14 * 1.4422495703074083;
  dVar91 = dVar90 * 2.519842099789747;
  local_1cc8 = 1.0 / local_1cc8;
  dVar92 = cbrt(dVar11);
  local_1ca0 = local_1cc8;
  if ((dVar12 == 0.0) && (!NAN(dVar12))) {
    local_1ca0 = 1.0 / dVar92;
  }
  dVar93 = dVar91 * dVar28 * local_1ca0;
  dVar94 = dVar93 * 0.053425 + 1.0;
  dVar95 = sqrt(dVar93);
  dVar96 = sqrt(dVar93);
  dVar96 = dVar93 * dVar96;
  dVar14 = dVar14 * dVar14 * 2.080083823051904;
  dVar97 = dVar14 * 1.5874010519681996;
  dVar98 = 1.0 / (dVar19 * dVar19);
  dVar99 = dVar98 * 1.5874010519681996;
  dVar100 = dVar97 * dVar99 * local_1ca0 * local_1ca0;
  dVar101 = dVar100 * 0.123235 + dVar96 * 0.204775 + dVar95 * 3.79785 + dVar93 * 0.8969;
  dVar102 = 16.081979498692537 / dVar101 + 1.0;
  dVar103 = log(dVar102);
  dVar104 = dVar94 * 0.0621814 * dVar103;
  local_1cb0 = local_1cf0;
  if ((double)in_RDI[0x31] < 0.0) {
    local_1cb0 = 0.0;
  }
  dVar105 = ((local_1c40 + local_1cb0) - 2.0) * 1.9236610509315362;
  dVar106 = dVar93 * 0.05137 + 1.0;
  dVar107 = dVar100 * 0.1562925 + dVar96 * 0.420775 + dVar95 * 7.05945 + dVar93 * 1.549425;
  dVar108 = 32.16395899738507 / dVar107 + 1.0;
  dVar109 = log(dVar108);
  dVar110 = dVar93 * 0.0278125 + 1.0;
  dVar96 = dVar100 * 0.1241775 + dVar96 * 0.1100325 + dVar95 * 5.1785 + dVar93 * 0.905775;
  dVar111 = 29.608749977793437 / dVar96 + 1.0;
  dVar112 = log(dVar111);
  dVar100 = dVar105 * 0.0197516734986138 * dVar110 * dVar112 +
            dVar105 * (dVar110 * dVar112 * -0.0197516734986138 +
                      dVar106 * -0.0310907 * dVar109 + dVar104) + -dVar104;
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    local_1cb8 = 0.0;
  }
  else {
    local_1cb8 = (local_1c98 * dVar100) / 2.0;
  }
  dVar104 = pdVar7[3];
  dVar113 = dVar104 * *in_RCX;
  dVar114 = dVar45 * 0.46914023462026644 + 1.0;
  dVar115 = 1.0 / dVar114;
  dVar3 = pdVar7[4];
  dVar116 = dVar3 * dVar52;
  dVar4 = pdVar7[5];
  dVar117 = dVar52 * dVar52;
  dVar118 = dVar4 * dVar117;
  dVar119 = dVar54 * dVar54;
  dVar120 = 1.0 / dVar119;
  dVar5 = pdVar7[6];
  dVar121 = *in_RCX * *in_RCX;
  dVar122 = dVar121 * dVar121;
  dVar123 = dVar122 * dVar121;
  dVar124 = dVar5 * dVar123;
  dVar125 = dVar41 * dVar41;
  dVar126 = dVar125 * dVar125 * dVar125 * dVar125;
  dVar127 = 1.0 / dVar126;
  dVar128 = dVar114 * dVar114;
  dVar129 = (1.0 / (dVar128 * dVar128)) / dVar128;
  dVar6 = pdVar7[7];
  dVar130 = dVar6 * dVar117 * dVar117;
  dVar131 = 1.0 / (dVar119 * dVar119);
  dVar132 = dVar130 * dVar131;
  dVar133 = dVar132 * 0.010661445329398458 * dVar123 * dVar127 * dVar129 +
            dVar124 * 0.010661445329398458 * dVar127 * dVar129 +
            dVar118 * dVar120 + dVar113 * 0.46914023462026644 * dVar44 * dVar115 + dVar116 * dVar55;
  dVar134 = local_1cb8 * dVar133;
  if ((dVar59 != 0.0) || (local_1cc0 = dVar58, NAN(dVar59))) {
    local_1cc0 = (double)in_RDI[0x31];
  }
  dVar135 = cbrt(dVar58);
  if ((dVar59 == 0.0) && (!NAN(dVar59))) {
    local_1cc8 = 1.0 / dVar135;
  }
  dVar136 = dVar91 * dVar28 * local_1cc8;
  dVar137 = dVar136 * 0.053425 + 1.0;
  dVar138 = sqrt(dVar136);
  dVar139 = sqrt(dVar136);
  dVar139 = dVar136 * dVar139;
  dVar140 = dVar97 * dVar99 * local_1cc8 * local_1cc8;
  dVar141 = dVar140 * 0.123235 + dVar139 * 0.204775 + dVar138 * 3.79785 + dVar136 * 0.8969;
  dVar142 = 16.081979498692537 / dVar141 + 1.0;
  dVar143 = log(dVar142);
  dVar144 = dVar137 * 0.0621814 * dVar143;
  dVar145 = dVar136 * 0.05137 + 1.0;
  dVar146 = dVar140 * 0.1562925 + dVar139 * 0.420775 + dVar138 * 7.05945 + dVar136 * 1.549425;
  dVar147 = 32.16395899738507 / dVar146 + 1.0;
  dVar148 = log(dVar147);
  dVar149 = dVar136 * 0.0278125 + 1.0;
  dVar139 = dVar140 * 0.1241775 + dVar139 * 0.1100325 + dVar138 * 5.1785 + dVar136 * 0.905775;
  dVar150 = 29.608749977793437 / dVar139 + 1.0;
  dVar151 = log(dVar150);
  dVar140 = dVar105 * 0.0197516734986138 * dVar149 * dVar151 +
            dVar105 * (dVar149 * dVar151 * -0.0197516734986138 +
                      dVar145 * -0.0310907 * dVar148 + dVar144) + -dVar144;
  if ((dVar60 != 0.0) || (NAN(dVar60))) {
    local_1cd8 = 0.0;
  }
  else {
    local_1cd8 = (local_1cc0 * dVar140) / 2.0;
  }
  dVar144 = dVar104 * in_RCX[2];
  dVar152 = dVar80 * 0.46914023462026644 + 1.0;
  dVar153 = 1.0 / dVar152;
  dVar154 = dVar3 * dVar85;
  dVar155 = dVar85 * dVar85;
  dVar156 = dVar4 * dVar155;
  dVar157 = dVar49 * dVar49;
  dVar158 = 1.0 / dVar157;
  dVar159 = in_RCX[2] * in_RCX[2];
  dVar160 = dVar159 * dVar159;
  dVar161 = dVar160 * dVar159;
  dVar162 = dVar5 * dVar161;
  dVar163 = dVar76 * dVar76;
  dVar164 = dVar163 * dVar163 * dVar163 * dVar163;
  dVar165 = 1.0 / dVar164;
  dVar166 = dVar152 * dVar152;
  dVar167 = (1.0 / (dVar166 * dVar166)) / dVar166;
  dVar168 = dVar6 * dVar155 * dVar155;
  dVar169 = 1.0 / (dVar157 * dVar157);
  dVar170 = dVar168 * dVar169;
  dVar171 = dVar170 * 0.010661445329398458 * dVar161 * dVar165 * dVar167 +
            dVar162 * 0.010661445329398458 * dVar165 * dVar167 +
            dVar156 * dVar158 + dVar144 * 0.46914023462026644 * dVar79 * dVar153 + dVar154 * dVar87;
  dVar172 = local_1cd8 * dVar171;
  dVar173 = dVar90 * 2.519842099789747 * dVar27;
  dVar174 = dVar173 * 0.053425 + 1.0;
  dVar175 = sqrt(dVar173);
  dVar176 = sqrt(dVar173);
  dVar176 = dVar173 * dVar176;
  dVar177 = dVar14 * 1.5874010519681996 * dVar98;
  dVar178 = dVar177 * 0.123235 + dVar176 * 0.204775 + dVar175 * 3.79785 + dVar173 * 0.8969;
  dVar179 = 16.081979498692537 / dVar178 + 1.0;
  dVar180 = log(dVar179);
  dVar181 = dVar174 * 0.0621814 * dVar180;
  dVar182 = dVar9 * dVar9;
  dVar183 = __x * __x;
  dVar184 = 1.0 / (dVar183 * dVar183);
  dVar185 = dVar182 * dVar182 * dVar184;
  local_1ce8 = local_1cf0;
  if ((dVar12 == 0.0) && (!NAN(dVar12))) {
    local_1ce8 = dVar92 * dVar11;
  }
  if ((dVar59 == 0.0) && (!NAN(dVar59))) {
    local_1cf0 = dVar135 * dVar58;
  }
  dVar186 = ((local_1ce8 + local_1cf0) - 2.0) * 1.9236610509315362;
  dVar187 = dVar173 * 0.05137 + 1.0;
  dVar188 = dVar177 * 0.1562925 + dVar176 * 0.420775 + dVar175 * 7.05945 + dVar173 * 1.549425;
  __x_00 = 32.16395899738507 / dVar188 + 1.0;
  dVar189 = log(__x_00);
  dVar190 = dVar173 * 0.0278125 + 1.0;
  dVar191 = dVar177 * 0.1241775 + dVar176 * 0.1100325 + dVar175 * 5.1785 + dVar173 * 0.905775;
  dVar192 = 29.608749977793437 / dVar191 + 1.0;
  dVar193 = log(dVar192);
  dVar194 = dVar190 * dVar193;
  dVar195 = dVar194 * -0.0197516734986138 + dVar187 * -0.0310907 * dVar189 + dVar181;
  dVar196 = dVar186 * dVar195;
  dVar197 = ((dVar186 * 0.0197516734986138 * dVar194 + dVar185 * dVar196 + -dVar181) - local_1cb8) -
            local_1cd8;
  dVar176 = pdVar7[9];
  dVar198 = dVar48 * 0.3 * (dVar51 + dVar84);
  dVar177 = dVar51 * 2.0 * dVar84;
  dVar199 = dVar198 - dVar177;
  dVar200 = dVar199 * dVar199;
  dVar201 = dVar176 * dVar200;
  dVar198 = dVar198 + dVar177;
  dVar202 = dVar198 * dVar198;
  dVar203 = 1.0 / dVar202;
  dVar177 = pdVar7[10];
  dVar204 = dVar200 * dVar200 * dVar200;
  dVar205 = dVar177 * dVar204;
  dVar206 = (1.0 / (dVar202 * dVar202)) / dVar202;
  dVar181 = pdVar7[0xb];
  dVar204 = dVar181 * dVar204;
  dVar207 = sqrt(dVar45 + dVar80);
  dVar80 = cbrt(dVar207 * 1.4142135623730951);
  dVar208 = dVar80 * dVar80;
  dVar45 = pdVar7[0xc];
  dVar209 = dVar45 * dVar200;
  dVar210 = dVar205 * dVar206 + dVar201 * dVar203 + pdVar7[8] +
            (dVar204 * dVar206 * 1.2599210498948732 * dVar208) / 2.0 +
            (dVar209 * dVar203 * 1.2599210498948732 * dVar208) / 2.0;
  dVar211 = dVar197 * dVar210;
  if ((*in_stack_00000008 != 0) && ((*(uint *)(*in_RDI + 0x40) & 1) != 0)) {
    lVar8 = in_RSI * (int)in_RDI[0xb];
    *(double *)(*in_stack_00000008 + lVar8 * 8) =
         local_1c68 + local_1c90 + dVar134 + dVar172 + dVar211 +
         *(double *)(*in_stack_00000008 + lVar8 * 8);
  }
  local_1de8 = dVar9 * (1.0 / dVar183);
  local_1d68 = dVar10 - local_1de8;
  dVar212 = (dVar17 * local_1c40 * dVar98 * dVar39 * dVar56) / 64.0;
  dVar213 = dVar21 * 1.4422495703074083 * dVar16;
  dVar21 = dVar20 * ((1.0 / dVar22) / dVar21);
  dVar30 = dVar30 * local_1c50;
  dVar214 = (1.0 / dVar19) / __x;
  dVar215 = dVar214 * 1.2599210498948732;
  dVar216 = dVar26 * dVar215 * dVar22 * local_1c48;
  dVar27 = dVar25 * dVar24 * 1.4422495703074083 * dVar27;
  dVar24 = (1.0 / (dVar22 * dVar22)) * 1.2599210498948732;
  dVar22 = local_1c48 * (1.0 / (dVar11 * dVar11));
  local_1d00 = (-dVar27 * dVar24 * dVar22 * local_1d68) / 54.0 - dVar216 / 54.0;
  local_1cf8 = local_1d00;
  if ((dVar29 == 0.0) && (!NAN(dVar29))) {
    local_1cf8 = 0.0;
  }
  dVar25 = 1.0 / (dVar31 * local_1c50);
  dVar217 = 1.0 / (dVar31 * dVar30);
  dVar218 = (1.0 / dVar32) / local_1c50;
  dVar219 = (1.0 / dVar32) / dVar30;
  dVar220 = (1.0 / dVar32) / (dVar31 * local_1c50);
  dVar31 = (1.0 / dVar32) / (dVar31 * dVar30);
  local_1c50 = (1.0 / (dVar32 * dVar32)) / local_1c50;
  if ((dVar29 != 0.0) || (NAN(dVar29))) {
    local_1d00 = 0.0;
  }
  dVar32 = dVar37 * (1.0 / dVar36);
  dVar36 = 1.0 / (dVar36 * local_1c58);
  dVar221 = local_1c58 * (dVar37 - 1.0);
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    local_1d08 = (((((((-(1.0 / dVar30) * local_1cf8) / 18.0 + (dVar25 * local_1cf8) / 240.0) -
                     (dVar217 * local_1cf8) / 4480.0) + (dVar218 * local_1cf8) / 103680.0) -
                   (dVar219 * local_1cf8) / 2838528.0) + (dVar220 * local_1cf8) / 89456640.0) -
                 (dVar31 * local_1cf8) / 3185049600.0) + (local_1c50 * local_1cf8) / 126340300800.0;
  }
  else {
    local_1d08 = local_1d00 * -2.6666666666666665 * dVar35 +
                 -(local_1c58 * 2.6666666666666665 *
                  (local_1c58 * 2.0 *
                   (-(dVar34 * local_1d00) * dVar37 +
                   -(dVar221 * 4.0) * local_1d00 + (dVar36 * local_1d00 * dVar37) / 2.0) +
                  -dVar32 * local_1d00 + local_1d00 * 2.0 * dVar38));
  }
  dVar241 = *in_RDX;
  dVar222 = (1.0 / dVar43) / (dVar41 * dVar241);
  dVar223 = (1.0 / dVar42) / (dVar125 * dVar41);
  dVar46 = 1.0 / (dVar46 * dVar46);
  dVar224 = dVar120 * *in_R9 * dVar44;
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    local_1d10 = 0.0;
  }
  else {
    local_1d10 = -(dVar17 * 0.046875) *
                 dVar20 * dVar39 * (dVar53 * 1.6666666666666667 * dVar224 +
                                   dVar2 * *in_R9 * 1.6666666666666667 * dVar44 * dVar55 +
                                   dVar40 * -0.010241644597362152 * dVar222 * dVar47 +
                                   dVar1 * dVar121 * 3.933423152200401e-05 * dVar223 * dVar46) +
                 -(dVar17 * 0.046875) * dVar20 * dVar23 * local_1d08 * dVar56 +
                 ((local_1d68 * 1.4422495703074083 * dVar16 * -0.046875 * dVar57 + -dVar212) -
                 (dVar213 * dVar21 * local_1c60 * dVar56 * local_1d68) / 64.0);
  }
  local_1d70 = -local_1d68;
  dVar98 = (dVar61 * local_1c40 * dVar98 * dVar71 * dVar88) / 64.0;
  dVar225 = dVar62 * 1.4422495703074083 * dVar16;
  dVar62 = dVar20 * ((1.0 / dVar63) / dVar62);
  dVar67 = dVar67 * local_1c78;
  dVar26 = dVar26 * dVar215 * dVar63 * local_1c48;
  dVar63 = (1.0 / (dVar63 * dVar63)) * 1.2599210498948732;
  local_1c48 = local_1c48 * (1.0 / (dVar58 * dVar58));
  local_1d20 = (-dVar27 * dVar63 * local_1c48 * local_1d70) / 54.0 - dVar26 / 54.0;
  local_1d18 = local_1d20;
  if ((dVar66 == 0.0) && (!NAN(dVar66))) {
    local_1d18 = 0.0;
  }
  dVar226 = 1.0 / (dVar68 * local_1c78);
  dVar227 = 1.0 / (dVar68 * dVar67);
  dVar228 = (1.0 / dVar69) / local_1c78;
  dVar229 = (1.0 / dVar69) / dVar67;
  dVar230 = (1.0 / dVar69) / (dVar68 * local_1c78);
  dVar68 = (1.0 / dVar69) / (dVar68 * dVar67);
  local_1c78 = (1.0 / (dVar69 * dVar69)) / local_1c78;
  if ((dVar66 != 0.0) || (NAN(dVar66))) {
    local_1d20 = 0.0;
  }
  dVar69 = dVar73 * (1.0 / dVar72);
  dVar72 = 1.0 / (dVar72 * local_1c80);
  dVar231 = local_1c80 * (dVar73 - 1.0);
  if ((dVar65 != 0.0) || (NAN(dVar65))) {
    local_1d28 = (((((((-(1.0 / dVar67) * local_1d18) / 18.0 + (dVar226 * local_1d18) / 240.0) -
                     (dVar227 * local_1d18) / 4480.0) + (dVar228 * local_1d18) / 103680.0) -
                   (dVar229 * local_1d18) / 2838528.0) + (dVar230 * local_1d18) / 89456640.0) -
                 (dVar68 * local_1d18) / 3185049600.0) + (local_1c78 * local_1d18) / 126340300800.0;
  }
  else {
    local_1d28 = local_1c80 * -2.6666666666666665 *
                 (-dVar69 * local_1d20 +
                 local_1c80 * 2.0 *
                 (-(dVar70 * local_1d20) * dVar73 +
                 -(dVar231 * 4.0) * local_1d20 + (dVar72 * local_1d20 * dVar73) / 2.0) +
                 local_1d20 * 2.0 * dVar74) + -(local_1d20 * 2.6666666666666665 * dVar33);
  }
  if ((dVar60 != 0.0) || (NAN(dVar60))) {
    local_1d30 = 0.0;
  }
  else {
    local_1d30 = -(dVar61 * 0.046875) * dVar20 * dVar64 * local_1d28 * dVar88 +
                 ((local_1d70 * 1.4422495703074083 * dVar16 * -0.046875 * dVar89 + -dVar98) -
                 (dVar225 * dVar62 * local_1c88 * dVar88 * local_1d70) / 64.0);
  }
  if ((dVar12 != 0.0) || (local_1d38 = local_1d68, NAN(dVar12))) {
    local_1d38 = 0.0;
  }
  dVar232 = dVar91 * dVar215 * local_1ca0;
  dVar11 = 1.0 / (dVar92 * dVar11);
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    local_1d40 = 0.0;
  }
  else {
    local_1d40 = (-dVar11 * local_1d68) / 3.0;
  }
  dVar233 = dVar91 * dVar28 * local_1d40;
  dVar234 = (dVar233 * 0.053425 + -(dVar232 * 0.017808333333333332)) * 0.0621814 * dVar103;
  dVar94 = dVar94 * (1.0 / (dVar101 * dVar101));
  dVar235 = -(dVar232 / 3.0) + dVar233;
  dVar101 = (1.0 / dVar95) * dVar235;
  dVar236 = sqrt(dVar93);
  dVar235 = dVar236 * dVar235;
  dVar237 = (1.0 / (dVar19 * dVar19)) / __x;
  dVar19 = dVar237 * 1.5874010519681996;
  dVar93 = dVar97 * dVar19 * local_1ca0 * local_1ca0;
  dVar238 = dVar97 * dVar99 * local_1ca0 * local_1d40;
  dVar102 = 1.0 / dVar102;
  dVar239 = dVar94 * 1.0 *
            (dVar238 * 0.24647 +
            ((dVar235 * 0.3071625 +
             dVar233 * 0.8969 + dVar101 * 1.898925 + -(dVar232 * 0.29896666666666666)) -
            dVar93 * 0.08215666666666667)) * dVar102;
  dVar106 = dVar106 * (1.0 / (dVar107 * dVar107));
  dVar108 = 1.0 / dVar108;
  dVar107 = (dVar233 * 0.0278125 + -(dVar232 * 0.009270833333333334)) * dVar112;
  dVar96 = 1.0 / (dVar96 * dVar96);
  dVar240 = dVar238 * 0.248355 +
            ((dVar235 * 0.16504875 + dVar233 * 0.905775 + dVar101 * 2.58925 + -(dVar232 * 0.301925))
            - dVar93 * 0.082785);
  dVar111 = 1.0 / dVar111;
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    local_1d48 = 0.0;
  }
  else {
    local_1d48 = (local_1c98 *
                 (-(dVar105 * dVar110 * 0.5848223622634646) * dVar96 * dVar240 * dVar111 +
                 dVar105 * 0.0197516734986138 * dVar107 +
                 dVar105 * (dVar110 * dVar96 * 0.5848223622634646 * dVar240 * dVar111 +
                           dVar107 * -0.0197516734986138 +
                           (((dVar233 * 0.05137 + -(dVar232 * 0.017123333333333334)) * -0.0310907 *
                             dVar109 + dVar106 * 1.0 *
                                       (dVar238 * 0.312585 +
                                       ((dVar235 * 0.6311625 +
                                        dVar233 * 1.549425 +
                                        dVar101 * 3.529725 + -(dVar232 * 0.516475)) -
                                       dVar93 * 0.104195)) * dVar108 + dVar234) - dVar239)) +
                 -dVar234 + dVar239)) / 2.0 + (local_1d38 * dVar100) / 2.0;
  }
  dVar101 = *in_R9;
  dVar234 = 1.0 / (dVar119 * dVar54);
  dVar107 = *in_R9;
  dVar233 = *in_RDX;
  dVar235 = 1.0 / (dVar126 * dVar233);
  dVar238 = dVar122 * dVar121 * *in_RCX;
  dVar241 = (1.0 / dVar43) / (dVar126 * dVar41 * dVar241);
  dVar114 = (1.0 / (dVar128 * dVar128)) / (dVar128 * dVar114);
  dVar131 = dVar6 * dVar117 * dVar52 * dVar131;
  dVar41 = (1.0 / dVar43) / (dVar126 * dVar41);
  dVar117 = dVar123 * dVar41;
  dVar239 = dVar117 * dVar129 * *in_R9;
  dVar130 = dVar130 * ((1.0 / (dVar119 * dVar119)) / dVar54);
  if ((dVar59 != 0.0) || (local_1d50 = local_1d70, NAN(dVar59))) {
    local_1d50 = 0.0;
  }
  dVar54 = dVar91 * dVar215 * local_1cc8;
  dVar58 = 1.0 / (dVar135 * dVar58);
  if ((dVar59 != 0.0) || (NAN(dVar59))) {
    local_1d58 = 0.0;
  }
  else {
    local_1d58 = (-dVar58 * local_1d70) / 3.0;
  }
  dVar119 = dVar91 * dVar28 * local_1d58;
  dVar215 = (dVar119 * 0.053425 + -(dVar54 * 0.017808333333333332)) * 0.0621814 * dVar143;
  dVar137 = dVar137 * (1.0 / (dVar141 * dVar141));
  dVar240 = -(dVar54 / 3.0) + dVar119;
  dVar141 = (1.0 / dVar138) * dVar240;
  dVar242 = sqrt(dVar136);
  dVar240 = dVar242 * dVar240;
  dVar19 = dVar97 * dVar19 * local_1cc8 * local_1cc8;
  dVar136 = dVar97 * dVar99 * local_1cc8 * local_1d58;
  dVar142 = 1.0 / dVar142;
  dVar243 = dVar137 * 1.0 *
            (dVar136 * 0.24647 +
            ((dVar240 * 0.3071625 +
             dVar119 * 0.8969 + dVar141 * 1.898925 + -(dVar54 * 0.29896666666666666)) -
            dVar19 * 0.08215666666666667)) * dVar142;
  dVar145 = dVar145 * (1.0 / (dVar146 * dVar146));
  dVar147 = 1.0 / dVar147;
  dVar146 = (dVar119 * 0.0278125 + -(dVar54 * 0.009270833333333334)) * dVar151;
  dVar139 = 1.0 / (dVar139 * dVar139);
  dVar244 = dVar136 * 0.248355 +
            ((dVar240 * 0.16504875 + dVar119 * 0.905775 + dVar141 * 2.58925 + -(dVar54 * 0.301925))
            - dVar19 * 0.082785);
  dVar150 = 1.0 / dVar150;
  if ((dVar60 != 0.0) || (NAN(dVar60))) {
    local_1d60 = 0.0;
  }
  else {
    local_1d60 = (local_1cc0 *
                 (-(dVar105 * dVar149 * 0.5848223622634646) * dVar139 * dVar244 * dVar150 +
                 dVar105 * 0.0197516734986138 * dVar146 +
                 dVar105 * (dVar149 * dVar139 * 0.5848223622634646 * dVar244 * dVar150 +
                           dVar146 * -0.0197516734986138 +
                           (((dVar119 * 0.05137 + -(dVar54 * 0.017123333333333334)) * -0.0310907 *
                             dVar148 + dVar145 * 1.0 *
                                       (dVar136 * 0.312585 +
                                       ((dVar240 * 0.6311625 +
                                        dVar119 * 1.549425 +
                                        dVar141 * 3.529725 + -(dVar54 * 0.516475)) -
                                       dVar19 * 0.104195)) * dVar147 + dVar215) - dVar243)) +
                 -dVar215 + dVar243)) / 2.0 + (local_1d50 * dVar140) / 2.0;
  }
  dVar119 = dVar214 * 2.519842099789747;
  dVar180 = dVar90 * 0.0011073470983333333 * dVar119 * dVar180;
  dVar136 = (1.0 / dVar175) * 1.4422495703074083 * dVar15 * dVar214;
  dVar141 = dVar90 * dVar119;
  dVar146 = sqrt(dVar173);
  dVar146 = dVar146 * 1.4422495703074083 * dVar15 * dVar214;
  dVar237 = dVar14 * 1.5874010519681996 * dVar237;
  dVar14 = dVar174 * (1.0 / (dVar178 * dVar178)) * 1.0 *
           (dVar237 * -0.08215666666666667 +
           dVar146 * -0.1023875 + dVar136 * -0.632975 + -(dVar141 * 0.29896666666666666)) *
           (1.0 / dVar179);
  dVar9 = dVar182 * dVar9 * dVar184 * 4.0 * dVar196;
  dVar196 = dVar182 * dVar182 * (1.0 / (dVar183 * dVar183 * __x)) * 4.0 * dVar196;
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    local_1d68 = 0.0;
  }
  else {
    local_1d68 = dVar92 * 1.3333333333333333 * local_1d68;
  }
  if ((dVar59 != 0.0) || (NAN(dVar59))) {
    local_1d70 = 0.0;
  }
  else {
    local_1d70 = dVar135 * 1.3333333333333333 * local_1d70;
  }
  dVar173 = (local_1d68 + local_1d70) * 1.9236610509315362;
  dVar174 = 1.0 / (dVar191 * dVar191);
  dVar175 = dVar237 * -0.082785 +
            dVar146 * -0.05501625 + dVar136 * -0.8630833333333333 + -(dVar141 * 0.301925);
  dVar192 = 1.0 / dVar192;
  dVar90 = dVar185 * dVar186 * (dVar190 * dVar174 * 0.5848223622634646 * dVar175 * dVar192 +
                               dVar90 * 0.00018311447306006544 * dVar119 * dVar193 +
                               (((dVar90 * 0.0005323764196666666 * dVar119 * dVar189 +
                                 dVar187 * (1.0 / (dVar188 * dVar188)) * 1.0 *
                                 (dVar237 * -0.104195 +
                                 dVar146 * -0.2103875 + dVar136 * -1.176575 + -(dVar141 * 0.516475))
                                 * (1.0 / __x_00)) - dVar180) - dVar14));
  dVar15 = dVar186 * 1.4422495703074083 * 0.00018311447306006544 * dVar15 * dVar214 * dVar193;
  dVar119 = dVar186 * dVar190 * 0.5848223622634646 * dVar174 * dVar175 * dVar192;
  dVar176 = dVar176 * dVar199;
  dVar136 = (dVar48 * *in_R9 * dVar44) / 2.0;
  dVar84 = *in_R9 * dVar44 * 3.3333333333333335 * dVar84;
  dVar141 = -dVar136 + dVar84;
  dVar146 = 1.0 / (dVar202 * dVar198);
  dVar84 = -dVar136 - dVar84;
  dVar136 = dVar200 * dVar200 * dVar199;
  dVar177 = dVar177 * dVar136;
  dVar174 = (1.0 / (dVar202 * dVar202)) / (dVar202 * dVar198);
  dVar136 = dVar181 * dVar136 * dVar206;
  dVar208 = dVar208 * 1.2599210498948732;
  dVar175 = dVar204 * dVar174;
  dVar184 = pow(2.0,0.16666666666666666);
  dVar184 = dVar184 * dVar184 * dVar184 * dVar184 * dVar184;
  dVar178 = dVar204 * dVar206 * dVar184;
  dVar207 = 1.0 / dVar207;
  dVar183 = (1.0 / dVar80) * dVar207;
  dVar179 = dVar183 * *in_RCX * dVar222;
  dVar45 = dVar45 * dVar199 * dVar203;
  dVar181 = dVar209 * dVar146;
  dVar182 = dVar209 * dVar203 * dVar184;
  if ((in_stack_00000008[1] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar8 = in_RSI * *(int *)((long)in_RDI + 0x5c);
    *(double *)(in_stack_00000008[1] + lVar8 * 8) =
         __x * (local_1d10 + local_1d30 + local_1d48 * dVar133 +
                local_1cb8 *
                (dVar132 * 0.08002740741160218 * dVar238 * dVar241 * dVar114 +
                -(dVar132 * 0.17058312527037534 * dVar123 * dVar235) * dVar129 +
                dVar130 * 0.07107630219598972 * dVar239 +
                dVar131 * 0.07107630219598972 * dVar239 +
                dVar5 * dVar238 * 0.08002740741160218 * dVar241 * dVar114 +
                -(dVar124 * 0.17058312527037534) * dVar235 * dVar129 +
                dVar118 * 3.3333333333333335 * dVar234 * dVar107 * dVar44 +
                dVar4 * dVar52 * 3.3333333333333335 * dVar224 +
                dVar116 * 1.6666666666666667 * dVar224 +
                dVar3 * dVar101 * 1.6666666666666667 * dVar44 * dVar55 +
                dVar113 * -1.2510406256540438 * dVar222 * dVar115 +
                dVar104 * dVar121 * 0.5869134926388231 * dVar223 * (1.0 / dVar128)) +
                local_1d60 * dVar171 +
                (((((dVar173 * 0.0197516734986138 * dVar194 +
                    dVar185 * dVar173 * dVar195 + ((dVar180 + dVar14 + dVar9) - dVar196) + dVar90) -
                   dVar15) - dVar119) - local_1d48) - local_1d60) * dVar210 +
               dVar197 * (-(dVar182 * 0.4444444444444444) * dVar179 +
                         -dVar181 * dVar208 * dVar84 +
                         dVar45 * dVar208 * dVar141 +
                         -(dVar178 * 0.4444444444444444) * dVar179 +
                         -(dVar175 * 3.0) * dVar208 * dVar84 +
                         dVar136 * 3.0 * dVar208 * dVar141 +
                         -(dVar205 * 6.0 * dVar174) * dVar84 +
                         dVar177 * 6.0 * dVar206 * dVar141 +
                         dVar176 * 2.0 * dVar203 * dVar141 + -(dVar201 * 2.0 * dVar146 * dVar84))) +
         local_1c68 + local_1c90 + dVar134 + dVar172 + dVar211 +
         *(double *)(in_stack_00000008[1] + lVar8 * 8);
  }
  local_1de8 = -dVar10 - local_1de8;
  local_1d80 = (-dVar27 * dVar24 * dVar22 * local_1de8) / 54.0 - dVar216 / 54.0;
  local_1d78 = local_1d80;
  if ((dVar29 == 0.0) && (!NAN(dVar29))) {
    local_1d78 = 0.0;
  }
  if ((dVar29 != 0.0) || (NAN(dVar29))) {
    local_1d80 = 0.0;
  }
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    local_1d88 = (((((((-(1.0 / dVar30) * local_1d78) / 18.0 + (dVar25 * local_1d78) / 240.0) -
                     (dVar217 * local_1d78) / 4480.0) + (dVar218 * local_1d78) / 103680.0) -
                   (dVar219 * local_1d78) / 2838528.0) + (dVar220 * local_1d78) / 89456640.0) -
                 (dVar31 * local_1d78) / 3185049600.0) + (local_1c50 * local_1d78) / 126340300800.0;
  }
  else {
    local_1d88 = local_1d80 * -2.6666666666666665 * dVar35 +
                 -(local_1c58 * 2.6666666666666665 *
                  (local_1c58 * 2.0 *
                   (-(dVar34 * local_1d80) * dVar37 +
                   -(dVar221 * 4.0) * local_1d80 + (dVar36 * local_1d80 * dVar37) / 2.0) +
                  -dVar32 * local_1d80 + local_1d80 * 2.0 * dVar38));
  }
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    local_1d90 = 0.0;
  }
  else {
    local_1d90 = -(dVar17 * 0.046875) * dVar20 * dVar23 * local_1d88 * dVar56 +
                 ((local_1de8 * 1.4422495703074083 * dVar16 * -0.046875 * dVar57 + -dVar212) -
                 (dVar213 * dVar21 * local_1c60 * dVar56 * local_1de8) / 64.0);
  }
  local_1df0 = -local_1de8;
  local_1da0 = (-dVar27 * dVar63 * local_1c48 * local_1df0) / 54.0 - dVar26 / 54.0;
  local_1d98 = local_1da0;
  if ((dVar66 == 0.0) && (!NAN(dVar66))) {
    local_1d98 = 0.0;
  }
  if ((dVar66 != 0.0) || (NAN(dVar66))) {
    local_1da0 = 0.0;
  }
  if ((dVar65 != 0.0) || (NAN(dVar65))) {
    local_1da8 = (((((((-(1.0 / dVar67) * local_1d98) / 18.0 + (dVar226 * local_1d98) / 240.0) -
                     (dVar227 * local_1d98) / 4480.0) + (dVar228 * local_1d98) / 103680.0) -
                   (dVar229 * local_1d98) / 2838528.0) + (dVar230 * local_1d98) / 89456640.0) -
                 (dVar68 * local_1d98) / 3185049600.0) + (local_1c78 * local_1d98) / 126340300800.0;
  }
  else {
    local_1da8 = local_1da0 * -2.6666666666666665 * dVar33 +
                 -(local_1c80 * 2.6666666666666665 *
                  (local_1c80 * 2.0 *
                   (-(dVar70 * local_1da0) * dVar73 +
                   -(dVar231 * 4.0) * local_1da0 + (dVar72 * local_1da0 * dVar73) / 2.0) +
                  local_1da0 * 2.0 * dVar74 + -(dVar69 * local_1da0)));
  }
  dVar10 = (1.0 / dVar78) / (dVar76 * in_RDX[1]);
  dVar18 = (1.0 / dVar77) / (dVar163 * dVar76);
  dVar24 = 1.0 / (dVar81 * dVar81);
  dVar21 = dVar158 * in_R9[1] * dVar79;
  if ((dVar60 != 0.0) || (NAN(dVar60))) {
    local_1db0 = 0.0;
  }
  else {
    local_1db0 = -(dVar61 * 0.046875) *
                 dVar20 * dVar71 * (dVar86 * 1.6666666666666667 * dVar21 +
                                   dVar2 * in_R9[1] * 1.6666666666666667 * dVar79 * dVar87 +
                                   dVar75 * -0.010241644597362152 * dVar10 * dVar82 +
                                   dVar1 * dVar159 * 3.933423152200401e-05 * dVar18 * dVar24) +
                 -(dVar61 * 0.046875) * dVar20 * dVar64 * local_1da8 * dVar88 +
                 ((local_1df0 * 1.4422495703074083 * dVar16 * -0.046875 * dVar89 + -dVar98) -
                 (dVar225 * dVar62 * local_1c88 * dVar88 * local_1df0) / 64.0);
  }
  if ((dVar12 != 0.0) || (local_1db8 = local_1de8, NAN(dVar12))) {
    local_1db8 = 0.0;
  }
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    local_1dc0 = 0.0;
  }
  else {
    local_1dc0 = (-dVar11 * local_1de8) / 3.0;
  }
  dVar11 = dVar91 * dVar28 * local_1dc0;
  dVar103 = (dVar11 * 0.053425 + -(dVar232 * 0.017808333333333332)) * 0.0621814 * dVar103;
  dVar16 = -(dVar232 / 3.0) + dVar11;
  dVar22 = (1.0 / dVar95) * dVar16;
  dVar236 = dVar236 * dVar16;
  dVar16 = dVar97 * dVar99 * local_1ca0 * local_1dc0;
  dVar23 = dVar94 * 1.0 *
           (dVar16 * 0.24647 +
           ((dVar236 * 0.3071625 +
            dVar11 * 0.8969 + dVar22 * 1.898925 + -(dVar232 * 0.29896666666666666)) -
           dVar93 * 0.08215666666666667)) * dVar102;
  dVar112 = (dVar11 * 0.0278125 + -(dVar232 * 0.009270833333333334)) * dVar112;
  dVar25 = dVar16 * 0.248355 +
           ((dVar236 * 0.16504875 + dVar11 * 0.905775 + dVar22 * 2.58925 + -(dVar232 * 0.301925)) -
           dVar93 * 0.082785);
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    local_1dc8 = 0.0;
  }
  else {
    local_1dc8 = (local_1db8 * dVar100) / 2.0 +
                 (local_1c98 *
                 (-(dVar105 * dVar110 * 0.5848223622634646) * dVar96 * dVar25 * dVar111 +
                 dVar105 * 0.0197516734986138 * dVar112 +
                 dVar105 * (dVar110 * dVar96 * 0.5848223622634646 * dVar25 * dVar111 +
                           dVar112 * -0.0197516734986138 +
                           (((dVar11 * 0.05137 + -(dVar232 * 0.017123333333333334)) * -0.0310907 *
                             dVar109 + dVar106 * 1.0 *
                                       (dVar16 * 0.312585 +
                                       ((dVar236 * 0.6311625 +
                                        dVar11 * 1.549425 +
                                        dVar22 * 3.529725 + -(dVar232 * 0.516475)) -
                                       dVar93 * 0.104195)) * dVar108 + dVar103) - dVar23)) +
                 -dVar103 + dVar23)) / 2.0;
  }
  if ((dVar59 != 0.0) || (local_1dd0 = local_1df0, NAN(dVar59))) {
    local_1dd0 = 0.0;
  }
  if ((dVar59 != 0.0) || (NAN(dVar59))) {
    local_1dd8 = 0.0;
  }
  else {
    local_1dd8 = (-dVar58 * local_1df0) / 3.0;
  }
  dVar11 = dVar91 * dVar28 * local_1dd8;
  dVar143 = (dVar11 * 0.053425 + -(dVar54 * 0.017808333333333332)) * 0.0621814 * dVar143;
  dVar16 = -(dVar54 / 3.0) + dVar11;
  dVar22 = (1.0 / dVar138) * dVar16;
  dVar242 = dVar242 * dVar16;
  dVar16 = dVar97 * dVar99 * local_1cc8 * local_1dd8;
  dVar23 = dVar137 * 1.0 *
           (dVar16 * 0.24647 +
           ((dVar242 * 0.3071625 +
            dVar11 * 0.8969 + dVar22 * 1.898925 + -(dVar54 * 0.29896666666666666)) -
           dVar19 * 0.08215666666666667)) * dVar142;
  dVar151 = (dVar11 * 0.0278125 + -(dVar54 * 0.009270833333333334)) * dVar151;
  dVar25 = dVar16 * 0.248355 +
           ((dVar242 * 0.16504875 + dVar11 * 0.905775 + dVar22 * 2.58925 + -(dVar54 * 0.301925)) -
           dVar19 * 0.082785);
  if ((dVar60 != 0.0) || (NAN(dVar60))) {
    local_1de0 = 0.0;
  }
  else {
    local_1de0 = (local_1dd0 * dVar140) / 2.0 +
                 (local_1cc0 *
                 (-(dVar105 * dVar149 * 0.5848223622634646) * dVar139 * dVar25 * dVar150 +
                 dVar105 * 0.0197516734986138 * dVar151 +
                 dVar105 * (dVar149 * dVar139 * 0.5848223622634646 * dVar25 * dVar150 +
                           dVar151 * -0.0197516734986138 +
                           (((dVar11 * 0.05137 + -(dVar54 * 0.017123333333333334)) * -0.0310907 *
                             dVar148 + dVar145 * 1.0 *
                                       (dVar16 * 0.312585 +
                                       ((dVar242 * 0.6311625 +
                                        dVar11 * 1.549425 + dVar22 * 3.529725 + -(dVar54 * 0.516475)
                                        ) - dVar19 * 0.104195)) * dVar147 + dVar143) - dVar23)) +
                 -dVar143 + dVar23)) / 2.0;
  }
  dVar16 = 1.0 / (dVar157 * dVar49);
  dVar11 = in_RDX[1];
  dVar19 = 1.0 / (dVar164 * dVar11);
  dVar22 = dVar160 * dVar159 * in_RCX[2];
  dVar23 = (1.0 / dVar78) / (dVar164 * dVar76 * in_RDX[1]);
  dVar25 = (1.0 / (dVar166 * dVar166)) / (dVar166 * dVar152);
  dVar169 = dVar6 * dVar155 * dVar85 * dVar169;
  dVar26 = (1.0 / dVar78) / (dVar164 * dVar76);
  dVar28 = dVar161 * dVar26;
  dVar27 = dVar28 * dVar167 * in_R9[1];
  dVar168 = dVar168 * ((1.0 / (dVar157 * dVar157)) / dVar49);
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    local_1de8 = 0.0;
  }
  else {
    local_1de8 = dVar92 * 1.3333333333333333 * local_1de8;
  }
  if ((dVar59 != 0.0) || (NAN(dVar59))) {
    local_1df0 = 0.0;
  }
  else {
    local_1df0 = dVar135 * 1.3333333333333333 * local_1df0;
  }
  dVar12 = (local_1de8 + local_1df0) * 1.9236610509315362;
  dVar29 = (dVar48 * in_R9[1] * dVar79) / 2.0;
  dVar32 = dVar51 * 3.3333333333333335 * in_R9[1] * dVar79;
  dVar31 = -dVar29 + dVar32;
  dVar32 = -dVar29 - dVar32;
  dVar183 = dVar183 * in_RCX[2] * dVar10;
  if ((in_stack_00000008[1] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar8 = in_RSI * *(int *)((long)in_RDI + 0x5c);
    *(double *)(in_stack_00000008[1] + 8 + lVar8 * 8) =
         __x * (local_1d90 + local_1db0 + local_1dc8 * dVar133 + local_1de0 * dVar171 +
                local_1cd8 *
                (dVar170 * 0.08002740741160218 * dVar22 * dVar23 * dVar25 +
                -(dVar170 * 0.17058312527037534 * dVar161 * dVar19) * dVar167 +
                dVar168 * 0.07107630219598972 * dVar27 +
                dVar169 * 0.07107630219598972 * dVar27 +
                dVar5 * dVar22 * 0.08002740741160218 * dVar23 * dVar25 +
                -(dVar162 * 0.17058312527037534) * dVar19 * dVar167 +
                dVar156 * 3.3333333333333335 * dVar16 * in_R9[1] * dVar79 +
                dVar4 * dVar85 * 3.3333333333333335 * dVar21 +
                dVar154 * 1.6666666666666667 * dVar21 +
                dVar3 * in_R9[1] * 1.6666666666666667 * dVar79 * dVar87 +
                dVar144 * -1.2510406256540438 * dVar10 * dVar153 +
                dVar104 * dVar159 * 0.5869134926388231 * dVar18 * (1.0 / dVar166)) +
                (((((dVar12 * 0.0197516734986138 * dVar194 +
                    dVar185 * dVar12 * dVar195 + (((dVar180 + dVar14) - dVar9) - dVar196) + dVar90)
                   - dVar15) - dVar119) - local_1dc8) - local_1de0) * dVar210 +
               dVar197 * (-(dVar182 * 0.4444444444444444) * dVar183 +
                         -dVar181 * dVar208 * dVar32 +
                         dVar45 * dVar208 * dVar31 +
                         -(dVar178 * 0.4444444444444444) * dVar183 +
                         -(dVar175 * 3.0) * dVar208 * dVar32 +
                         dVar136 * 3.0 * dVar208 * dVar31 +
                         -(dVar205 * 6.0) * dVar174 * dVar32 +
                         dVar177 * 6.0 * dVar206 * dVar31 +
                         dVar176 * 2.0 * dVar203 * dVar31 + -(dVar201 * 2.0 * dVar146 * dVar32))) +
         local_1c68 + local_1c90 + dVar134 + dVar172 + dVar211 +
         *(double *)(in_stack_00000008[1] + 8 + lVar8 * 8);
  }
  dVar9 = (1.0 / dVar42) / (dVar125 * *in_RDX);
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    local_1df8 = 0.0;
  }
  else {
    local_1df8 = dVar17 * -0.046875 *
                 dVar20 * dVar39 * (dVar1 * 0.003840616724010807 * dVar44 * dVar47 +
                                   -(dVar40 * 1.4750336820751504e-05 * dVar9 * dVar46));
  }
  dVar184 = dVar184 * (1.0 / dVar80);
  dVar10 = dVar184 * dVar207 * dVar44;
  if ((in_stack_00000008[2] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar8 = in_RSI * (int)in_RDI[0xc];
    *(double *)(in_stack_00000008[2] + lVar8 * 8) =
         __x * (local_1df8 +
                local_1cb8 *
                (-(dVar132 * 0.03001027777935082 * dVar117) * dVar114 +
                dVar132 * 0.06396867197639075 * dVar122 * *in_RCX * dVar127 * dVar129 +
                -(dVar124 * 0.03001027777935082) * dVar41 * dVar114 +
                dVar5 * dVar122 * *in_RCX * 0.06396867197639075 * dVar127 * dVar129 +
                dVar104 * 0.46914023462026644 * dVar44 * dVar115 +
                -(dVar113 * 0.22009255973955863 * dVar9 * (1.0 / dVar128))) +
               dVar197 * ((dVar204 * dVar206 * dVar10) / 6.0 + (dVar209 * dVar203 * dVar10) / 6.0))
         + *(double *)(in_stack_00000008[2] + lVar8 * 8);
  }
  if ((in_stack_00000008[2] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar8 = in_RSI * (int)in_RDI[0xc];
    *(double *)(in_stack_00000008[2] + 8 + lVar8 * 8) =
         *(double *)(in_stack_00000008[2] + 8 + lVar8 * 8) + 0.0;
  }
  dVar9 = (1.0 / dVar77) / (dVar163 * in_RDX[1]);
  if ((dVar60 != 0.0) || (NAN(dVar60))) {
    local_1e00 = 0.0;
  }
  else {
    local_1e00 = dVar61 * -0.046875 *
                 dVar20 * dVar71 * (dVar1 * 0.003840616724010807 * dVar79 * dVar82 +
                                   -(dVar75 * 1.4750336820751504e-05 * dVar9 * dVar24));
  }
  dVar184 = dVar184 * dVar207 * dVar79;
  if ((in_stack_00000008[2] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar8 = in_RSI * (int)in_RDI[0xc];
    *(double *)(in_stack_00000008[2] + 0x10 + lVar8 * 8) =
         __x * (local_1e00 +
                local_1cd8 *
                (-(dVar170 * 0.03001027777935082 * dVar28) * dVar25 +
                dVar170 * 0.06396867197639075 * dVar160 * in_RCX[2] * dVar165 * dVar167 +
                -(dVar162 * 0.03001027777935082) * dVar26 * dVar25 +
                dVar5 * dVar160 * in_RCX[2] * 0.06396867197639075 * dVar165 * dVar167 +
                dVar104 * 0.46914023462026644 * dVar79 * dVar153 +
                -(dVar144 * 0.22009255973955863 * dVar9 * (1.0 / dVar166))) +
               dVar197 * ((dVar204 * dVar206 * dVar184) / 6.0 + (dVar209 * dVar203 * dVar184) / 6.0)
               ) + *(double *)(in_stack_00000008[2] + 0x10 + lVar8 * 8);
  }
  if (((in_stack_00000008[3] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar8 = in_RSI * *(int *)((long)in_RDI + 100);
    *(double *)(in_stack_00000008[3] + lVar8 * 8) =
         *(double *)(in_stack_00000008[3] + lVar8 * 8) + 0.0;
  }
  if (((in_stack_00000008[3] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar8 = in_RSI * *(int *)((long)in_RDI + 100);
    *(double *)(in_stack_00000008[3] + 8 + lVar8 * 8) =
         *(double *)(in_stack_00000008[3] + 8 + lVar8 * 8) + 0.0;
  }
  dVar120 = dVar120 * dVar50;
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    local_1e08 = 0.0;
  }
  else {
    local_1e08 = dVar17 * -0.046875 *
                 dVar20 * dVar39 * (-dVar2 * dVar50 * dVar55 + -(dVar53 * dVar120));
  }
  dVar129 = dVar123 * ((1.0 / dVar43) / (dVar126 * dVar233)) * dVar129;
  dVar12 = dVar48 * 0.3 * dVar50;
  dVar9 = dVar50 * in_R9[1] * 2.0 * dVar83;
  dVar10 = dVar12 - dVar9;
  dVar12 = dVar12 + dVar9;
  if (((in_stack_00000008[4] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar8 = in_RSI * (int)in_RDI[0xd];
    *(double *)(in_stack_00000008[4] + lVar8 * 8) =
         __x * (local_1e08 +
                local_1cb8 *
                (-(dVar130 * 0.042645781317593834) * dVar129 +
                -(dVar131 * 0.042645781317593834) * dVar129 +
                -(dVar118 * 2.0 * dVar234) * dVar50 +
                -(dVar4 * dVar52 * 2.0) * dVar120 + -dVar3 * dVar50 * dVar55 + -(dVar116 * dVar120))
               + dVar197 * (-(dVar205 * 6.0) * dVar174 * dVar12 +
                           -(dVar201 * 2.0) * dVar146 * dVar12 +
                           -dVar181 * dVar208 * dVar12 +
                           dVar45 * dVar208 * dVar10 +
                           -(dVar175 * 3.0) * dVar208 * dVar12 +
                           dVar136 * 3.0 * dVar208 * dVar10 +
                           dVar176 * 2.0 * dVar203 * dVar10 + dVar177 * 6.0 * dVar206 * dVar10)) +
         *(double *)(in_stack_00000008[4] + lVar8 * 8);
  }
  dVar158 = dVar158 * dVar83;
  if ((dVar60 != 0.0) || (NAN(dVar60))) {
    local_1e10 = 0.0;
  }
  else {
    local_1e10 = dVar61 * -0.046875 *
                 dVar20 * dVar71 * (-dVar2 * dVar83 * dVar87 + -(dVar86 * dVar158));
  }
  dVar167 = dVar161 * ((1.0 / dVar78) / (dVar164 * dVar11)) * dVar167;
  dVar11 = dVar48 * 0.3 * dVar83;
  dVar9 = dVar51 * 2.0 * dVar83;
  dVar10 = dVar11 - dVar9;
  dVar11 = dVar11 + dVar9;
  if (((in_stack_00000008[4] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar8 = in_RSI * (int)in_RDI[0xd];
    *(double *)(in_stack_00000008[4] + 8 + lVar8 * 8) =
         __x * (local_1e10 +
                local_1cd8 *
                (-(dVar168 * 0.042645781317593834) * dVar167 +
                -(dVar169 * 0.042645781317593834) * dVar167 +
                -(dVar156 * 2.0 * dVar16) * dVar83 +
                -(dVar4 * dVar85 * 2.0) * dVar158 + -dVar3 * dVar83 * dVar87 + -(dVar154 * dVar158))
               + dVar197 * (-(dVar205 * 6.0) * dVar174 * dVar11 +
                           -(dVar201 * 2.0) * dVar146 * dVar11 +
                           -dVar181 * dVar208 * dVar11 +
                           dVar45 * dVar208 * dVar10 +
                           -(dVar175 * 3.0) * dVar208 * dVar11 +
                           dVar136 * 3.0 * dVar208 * dVar10 +
                           dVar176 * 2.0 * dVar203 * dVar10 + dVar177 * 6.0 * dVar206 * dVar10)) +
         *(double *)(in_stack_00000008[4] + 8 + lVar8 * 8);
  }
  return;
}

Assistant:

GPU_DEVICE_FUNCTION static inline void
func_vxc_pol(const xc_func_type *p, size_t ip, const double *rho, const double *sigma, xc_gga_out_params *out)
{
  double t1, t2, t3, t4, t6, t7, t8, t11;
  double t12, t15, t16, t17, t19, t20, t21, t22;
  double t23, t24, t25, t26, t28, t29, t30, t31;
  double t33, t34, t35, t36, t37, t38, t39, t40;
  double t41, t43, t48, t49, t50, t51, t52, t53;
  double t55, t61, t62, t63, t64, t69, t72, t76;
  double t77, t78, t80, t81, t82, t83, t84, t86;
  double t87, t88, t89, t90, t92, t96, t97, t98;
  double t100, t104, t105, t106, t111, t114, t118, tzk0;

  double t119, t120, t121, t123, t126, t127, t131, t132;
  double t135, t136, t137, t139, t143, t145, t149, t150;
  double t154, t155, t156, t160, t161, t163, t166, t167;
  double t171, t174, t176, tvrho0, t180, t183, t184, t189;
  double t191, t194, t195, t199, t201, t205, t207, t211;
  double t212, t216, t217, t218, t222, tvrho1, t225, t226;
  double t236, t237, t238, t241, tvsigma0, tvsigma1, t242, t243;
  double t253, t254, t255, t258, tvsigma2;

  gga_k_lgap_params *params;

  assert(p->params != NULL);
  params = (gga_k_lgap_params * ) (p->params);

  t1 = rho[0] <= p->dens_threshold;
  t2 = M_CBRT3;
  t3 = t2 * t2;
  t4 = M_CBRTPI;
  t6 = t3 * t4 * M_PI;
  t7 = rho[0] + rho[1];
  t8 = 0.1e1 / t7;
  t11 = 0.2e1 * rho[0] * t8 <= p->zeta_threshold;
  t12 = p->zeta_threshold - 0.1e1;
  t15 = 0.2e1 * rho[1] * t8 <= p->zeta_threshold;
  t16 = -t12;
  t17 = rho[0] - rho[1];
  t19 = my_piecewise5(t11, t12, t15, t16, t17 * t8);
  t20 = 0.1e1 + t19;
  t21 = t20 <= p->zeta_threshold;
  t22 = POW_1_3(p->zeta_threshold);
  t23 = t22 * t22;
  t24 = t23 * p->zeta_threshold;
  t25 = POW_1_3(t20);
  t26 = t25 * t25;
  t28 = my_piecewise3(t21, t24, t26 * t20);
  t29 = POW_1_3(t7);
  t30 = t29 * t29;
  t31 = t28 * t30;
  t33 = M_CBRT6;
  t34 = t33 * t33;
  t35 = params->mu[0] * t34;
  t36 = M_PI * M_PI;
  t37 = POW_1_3(t36);
  t38 = 0.1e1 / t37;
  t39 = sqrt(sigma[0]);
  t40 = t38 * t39;
  t41 = POW_1_3(rho[0]);
  t43 = 0.1e1 / t41 / rho[0];
  t48 = params->mu[1] * t33;
  t49 = t37 * t37;
  t50 = 0.1e1 / t49;
  t51 = t50 * sigma[0];
  t52 = rho[0] * rho[0];
  t53 = t41 * t41;
  t55 = 0.1e1 / t53 / t52;
  t61 = params->mu[2] / t36;
  t62 = t39 * sigma[0];
  t63 = t52 * t52;
  t64 = 0.1e1 / t63;
  t69 = exp(-t35 * t40 * t43 / 0.12e2 - t48 * t51 * t55 / 0.24e2 - t61 * t62 * t64 / 0.48e2);
  t72 = 0.1e1 + params->kappa * (0.1e1 - t69);
  t76 = my_piecewise3(t1, 0, 0.3e1 / 0.2e2 * t6 * t31 * t72);
  t77 = rho[1] <= p->dens_threshold;
  t78 = -t17;
  t80 = my_piecewise5(t15, t12, t11, t16, t78 * t8);
  t81 = 0.1e1 + t80;
  t82 = t81 <= p->zeta_threshold;
  t83 = POW_1_3(t81);
  t84 = t83 * t83;
  t86 = my_piecewise3(t82, t24, t84 * t81);
  t87 = t86 * t30;
  t88 = sqrt(sigma[2]);
  t89 = t38 * t88;
  t90 = POW_1_3(rho[1]);
  t92 = 0.1e1 / t90 / rho[1];
  t96 = t50 * sigma[2];
  t97 = rho[1] * rho[1];
  t98 = t90 * t90;
  t100 = 0.1e1 / t98 / t97;
  t104 = t88 * sigma[2];
  t105 = t97 * t97;
  t106 = 0.1e1 / t105;
  t111 = exp(-t35 * t89 * t92 / 0.12e2 - t48 * t96 * t100 / 0.24e2 - t61 * t104 * t106 / 0.48e2);
  t114 = 0.1e1 + params->kappa * (0.1e1 - t111);
  t118 = my_piecewise3(t77, 0, 0.3e1 / 0.2e2 * t6 * t87 * t114);
  tzk0 = t76 + t118;

  if(out->zk != NULL && (p->info->flags & XC_FLAGS_HAVE_EXC))
    out->zk[ip*p->dim.zk + 0] += tzk0;

  t119 = t7 * t7;
  t120 = 0.1e1 / t119;
  t121 = t17 * t120;
  t123 = my_piecewise5(t11, 0, t15, 0, t8 - t121);
  t126 = my_piecewise3(t21, 0, 0.5e1 / 0.3e1 * t26 * t123);
  t127 = t126 * t30;
  t131 = 0.1e1 / t29;
  t132 = t28 * t131;
  t135 = t6 * t132 * t72 / 0.1e2;
  t136 = t6 * t28;
  t137 = t30 * params->kappa;
  t139 = 0.1e1 / t41 / t52;
  t143 = t52 * rho[0];
  t145 = 0.1e1 / t53 / t143;
  t149 = t63 * rho[0];
  t150 = 0.1e1 / t149;
  t154 = t35 * t40 * t139 / 0.9e1 + t48 * t51 * t145 / 0.9e1 + t61 * t62 * t150 / 0.12e2;
  t155 = t154 * t69;
  t156 = t137 * t155;
  t160 = my_piecewise3(t1, 0, 0.3e1 / 0.2e2 * t6 * t127 * t72 + t135 - 0.3e1 / 0.2e2 * t136 * t156);
  t161 = t78 * t120;
  t163 = my_piecewise5(t15, 0, t11, 0, -t8 - t161);
  t166 = my_piecewise3(t82, 0, 0.5e1 / 0.3e1 * t84 * t163);
  t167 = t166 * t30;
  t171 = t86 * t131;
  t174 = t6 * t171 * t114 / 0.1e2;
  t176 = my_piecewise3(t77, 0, 0.3e1 / 0.2e2 * t6 * t167 * t114 + t174);
  tvrho0 = t76 + t118 + t7 * (t160 + t176);

  if(out->vrho != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vrho[ip*p->dim.vrho + 0] += tvrho0;

  t180 = my_piecewise5(t11, 0, t15, 0, -t8 - t121);
  t183 = my_piecewise3(t21, 0, 0.5e1 / 0.3e1 * t26 * t180);
  t184 = t183 * t30;
  t189 = my_piecewise3(t1, 0, 0.3e1 / 0.2e2 * t6 * t184 * t72 + t135);
  t191 = my_piecewise5(t15, 0, t11, 0, t8 - t161);
  t194 = my_piecewise3(t82, 0, 0.5e1 / 0.3e1 * t84 * t191);
  t195 = t194 * t30;
  t199 = t6 * t86;
  t201 = 0.1e1 / t90 / t97;
  t205 = t97 * rho[1];
  t207 = 0.1e1 / t98 / t205;
  t211 = t105 * rho[1];
  t212 = 0.1e1 / t211;
  t216 = t35 * t89 * t201 / 0.9e1 + t48 * t96 * t207 / 0.9e1 + t61 * t104 * t212 / 0.12e2;
  t217 = t216 * t111;
  t218 = t137 * t217;
  t222 = my_piecewise3(t77, 0, 0.3e1 / 0.2e2 * t6 * t195 * t114 + t174 - 0.3e1 / 0.2e2 * t199 * t218);
  tvrho1 = t76 + t118 + t7 * (t189 + t222);

  if(out->vrho != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vrho[ip*p->dim.vrho + 1] += tvrho1;

  t225 = 0.1e1 / t39;
  t226 = t38 * t225;
  t236 = -t35 * t226 * t43 / 0.24e2 - t48 * t50 * t55 / 0.24e2 - t61 * t39 * t64 / 0.32e2;
  t237 = t236 * t69;
  t238 = t137 * t237;
  t241 = my_piecewise3(t1, 0, -0.3e1 / 0.2e2 * t136 * t238);
  tvsigma0 = t7 * t241;

  if(out->vsigma != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vsigma[ip*p->dim.vsigma + 0] += tvsigma0;

  tvsigma1 = 0.e0;

  if(out->vsigma != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vsigma[ip*p->dim.vsigma + 1] += tvsigma1;

  t242 = 0.1e1 / t88;
  t243 = t38 * t242;
  t253 = -t35 * t243 * t92 / 0.24e2 - t48 * t50 * t100 / 0.24e2 - t61 * t88 * t106 / 0.32e2;
  t254 = t253 * t111;
  t255 = t137 * t254;
  t258 = my_piecewise3(t77, 0, -0.3e1 / 0.2e2 * t199 * t255);
  tvsigma2 = t7 * t258;

  if(out->vsigma != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vsigma[ip*p->dim.vsigma + 2] += tvsigma2;

}